

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_236::Checker::visitExpression(Checker *this,Expression *curr)

{
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
  *this_00;
  size_type *psVar1;
  int iVar2;
  Checker *pCVar3;
  _Hash_node_base _Var4;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
  _Var5;
  _Hash_node_base *p_Var6;
  bool bVar7;
  __node_ptr p_Var8;
  iterator iVar9;
  mapped_type *pmVar10;
  iterator __n_00;
  Expression *pEVar11;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var12;
  __node_type *__prev_n;
  ulong uVar13;
  size_type __n_01;
  ulong uVar14;
  _Hash_node_base _Var15;
  __hash_code __code;
  __node_base *p_Var16;
  undefined1 auVar17 [8];
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
  *__range3;
  __node_ptr __n;
  undefined1 auVar18 [16];
  undefined1 local_360 [8];
  EffectAnalyzer effects;
  undefined1 auStack_1e8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invalidated;
  Expression *local_68;
  Expression *curr_local;
  Expression *local_58;
  _Hash_node_base local_50;
  Expression *original;
  allocator_type local_39;
  Checker *pCStack_38;
  __buckets_alloc_type __alloc;
  
  this_00 = &this->activeOriginals;
  local_68 = curr;
  p_Var8 = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,(ulong)curr % (this->activeOriginals)._M_h._M_bucket_count,
                          &local_68,(__hash_code)&local_68);
  if (p_Var8 != (__node_ptr)0x0) {
    __assert_fail("!activeOriginals.count(curr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/LocalCSE.cpp"
                  ,0x178,"void wasm::(anonymous namespace)::Checker::visitExpression(Expression *)")
    ;
  }
  if ((this->activeOriginals)._M_h._M_element_count != 0) {
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)local_360,this->options,
               (this->
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               ).
               super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .currModule);
    local_58 = curr;
    EffectAnalyzer::visit((EffectAnalyzer *)local_360,curr);
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_1e8 = (undefined1  [8])0x0;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    p_Var16 = &(this->activeOriginals)._M_h._M_before_begin;
    while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
      local_50._M_nxt = p_Var16[1]._M_nxt;
      bVar7 = EffectAnalyzer::invalidates
                        ((EffectAnalyzer *)local_360,(EffectAnalyzer *)(p_Var16 + 3));
      if (bVar7) {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_1e8,
                   (value_type *)&stack0xffffffffffffffb0);
      }
    }
    curr_local = (Expression *)
                 invalidated.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
    pCStack_38 = this;
    for (auVar17 = auStack_1e8; auVar17 != (undefined1  [8])curr_local;
        auVar17 = (undefined1  [8])&((Expression *)auVar17)->type) {
      local_50._M_nxt = *(_Hash_node_base **)auVar17;
      iVar9 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)&stack0xffffffffffffffb0);
      if (iVar9.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      iVar2 = *(int *)((long)iVar9.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                             ._M_cur + 0x10);
      pmVar10 = std::
                unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ::operator[](&this->requestInfos->
                              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                             ,(key_type *)&stack0xffffffffffffffb0);
      pmVar10->requests = pmVar10->requests - iVar2;
      pmVar10 = std::
                unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ::operator[](&this->requestInfos->
                              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                             ,(key_type *)&stack0xffffffffffffffb0);
      if (pmVar10->requests == 0) {
        std::
        unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ::erase(&pCStack_38->requestInfos->
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ,(key_type *)&stack0xffffffffffffffb0);
      }
      std::
      unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
      ::erase(this_00,(key_type *)&stack0xffffffffffffffb0);
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_1e8)
    ;
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_360);
    this = pCStack_38;
    curr = local_58;
  }
  __n_00 = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this->requestInfos,&local_68);
  if (__n_00.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    return;
  }
  RequestInfo::validate
            ((RequestInfo *)
             ((long)__n_00.
                    super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                    ._M_cur + 0x10));
  if (*(int *)((long)__n_00.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                     ._M_cur + 0x10) == 0) {
    if (*(long *)((long)__n_00.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                        ._M_cur + 0x18) == 0) {
      return;
    }
    iVar9 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,
                   (key_type *)
                   ((long)__n_00.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                          ._M_cur + 0x18));
    if (iVar9.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
        ._M_cur != (__node_type *)0x0) {
      if (*(int *)((long)iVar9.
                         super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                         ._M_cur + 0x10) == 1) {
        std::
        unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
        ::erase(this_00,(key_type *)
                        ((long)__n_00.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                               ._M_cur + 0x18));
        return;
      }
      *(int *)((long)iVar9.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                     ._M_cur + 0x10) =
           *(int *)((long)iVar9.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                          ._M_cur + 0x10) + -1;
      return;
    }
    this_01 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)this->requestInfos;
    uVar13 = *(ulong *)((long)__n_00.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                              ._M_cur + 8) % this_01->_M_bucket_count;
    _Var5._M_cur = (__node_type *)this_01->_M_buckets[uVar13];
    do {
      __prev_n = _Var5._M_cur;
      _Var5._M_cur = (__node_type *)(__prev_n->super__Hash_node_base)._M_nxt;
    } while ((_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
              )_Var5._M_cur !=
             __n_00.
             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
             ._M_cur);
    std::
    _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(this_01,uVar13,&__prev_n->super__Hash_node_base,
               (__node_ptr)
               __n_00.
               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
               ._M_cur);
    return;
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)auStack_1e8,this->options,
             (this->
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             ).
             super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .currModule,curr);
  bVar7 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)auStack_1e8);
  if ((bVar7) ||
     (bVar7 = Properties::isGenerative
                        (curr,(FeatureSet)
                              (((this->
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                ).
                                super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                               .currModule)->features).features), bVar7)) {
    std::
    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
    ::erase(&this->requestInfos->
             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ,&local_68);
  }
  else {
    local_360._0_4_ =
         ((RequestInfo *)
         ((long)__n_00.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                ._M_cur + 0x10))->requests;
    EffectAnalyzer::EffectAnalyzer(&effects,(EffectAnalyzer *)auStack_1e8);
    local_50._M_nxt = (_Hash_node_base *)this_00;
    pEVar11 = (Expression *)operator_new(0x188);
    *(_Hash_node_base **)pEVar11 = (_Hash_node_base *)0x0;
    pCStack_38 = (Checker *)&pEVar11->type;
    (pEVar11->type).id = (uintptr_t)curr;
    pEVar11[1]._id = local_360._0_4_;
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&pEVar11[1].type,&effects);
    pCVar3 = (Checker *)(pEVar11->type).id;
    curr_local = (Expression *)(this->activeOriginals)._M_h._M_bucket_count;
    uVar13 = (ulong)pCVar3 % (ulong)curr_local;
    local_58 = pEVar11;
    original = pEVar11;
    p_Var8 = std::
             _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_node(&this_00->_M_h,uVar13,(key_type *)pCStack_38,(__hash_code)curr_local);
    if (p_Var8 == (__node_ptr)0x0) {
      pCStack_38 = pCVar3;
      auVar18 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->activeOriginals)._M_h._M_rehash_policy,(ulong)curr_local,
                           (this->activeOriginals)._M_h._M_element_count);
      __n_01 = auVar18._8_8_;
      if ((auVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __s = (this_00->_M_h)._M_buckets;
      }
      else {
        if (__n_01 == 1) {
          __s = &(this->activeOriginals)._M_h._M_single_bucket;
          (this->activeOriginals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                          (&local_39,__n_01);
          memset(__s,0,__n_01 * 8);
        }
        p_Var16 = &(this->activeOriginals)._M_h._M_before_begin;
        _Var4._M_nxt = (this->activeOriginals)._M_h._M_before_begin._M_nxt;
        (this->activeOriginals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        uVar13 = 0;
LAB_00898914:
        _Var15._M_nxt = _Var4._M_nxt;
        uVar14 = uVar13;
        if (_Var15._M_nxt != (_Hash_node_base *)0x0) {
          _Var4._M_nxt = (_Var15._M_nxt)->_M_nxt;
          uVar13 = (ulong)_Var15._M_nxt[1]._M_nxt % __n_01;
          if (__s[uVar13] == (_Hash_node_base *)0x0) goto LAB_00898947;
          (_Var15._M_nxt)->_M_nxt = __s[uVar13]->_M_nxt;
          pp_Var12 = &__s[uVar13]->_M_nxt;
          uVar13 = uVar14;
          goto LAB_0089895e;
        }
        std::
        _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_deallocate_buckets(&this_00->_M_h);
        (this->activeOriginals)._M_h._M_bucket_count = __n_01;
        (this->activeOriginals)._M_h._M_buckets = __s;
        uVar13 = (ulong)pCStack_38 % __n_01;
      }
      if (__s[uVar13] == (_Hash_node_base *)0x0) {
        p_Var6 = (this->activeOriginals)._M_h._M_before_begin._M_nxt;
        *(_Hash_node_base **)&local_58->_id = p_Var6;
        (this->activeOriginals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_58;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          __s[(ulong)p_Var6[1]._M_nxt % (this->activeOriginals)._M_h._M_bucket_count] =
               (__node_base_ptr)local_58;
          __s = (this->activeOriginals)._M_h._M_buckets;
        }
        __s[uVar13] = &(this->activeOriginals)._M_h._M_before_begin;
      }
      else {
        *(_Hash_node_base **)&local_58->_id = __s[uVar13]->_M_nxt;
        __s[uVar13]->_M_nxt = (_Hash_node_base *)local_58;
      }
      psVar1 = &(this->activeOriginals)._M_h._M_element_count;
      *psVar1 = *psVar1 + 1;
      original = (Expression *)0x0;
    }
    std::
    _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&stack0xffffffffffffffb0);
    EffectAnalyzer::~EffectAnalyzer(&effects);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)auStack_1e8);
  return;
LAB_00898947:
  (_Var15._M_nxt)->_M_nxt = p_Var16->_M_nxt;
  p_Var16->_M_nxt = _Var15._M_nxt;
  __s[uVar13] = p_Var16;
  if ((_Var15._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var12 = __s + uVar14;
LAB_0089895e:
    *pp_Var12 = _Var15._M_nxt;
  }
  goto LAB_00898914;
}

Assistant:

void visitExpression(Expression* curr) {
    // This is the first time we encounter this expression.
    assert(!activeOriginals.count(curr));

    // Given the current expression, see what it invalidates of the currently-
    // hashed expressions, if there are any.
    if (!activeOriginals.empty()) {
      EffectAnalyzer effects(options, *getModule());
      // We only need to visit this node itself, as we have already visited its
      // children by the time we get here.
      effects.visit(curr);

      std::vector<Expression*> invalidated;
      for (auto& kv : activeOriginals) {
        auto* original = kv.first;
        auto& originalInfo = kv.second;
        if (effects.invalidates(originalInfo.effects)) {
          invalidated.push_back(original);
        }
      }

      for (auto* original : invalidated) {
        // Remove all requests after this expression, as we cannot optimize to
        // them.
        requestInfos[original].requests -=
          activeOriginals.at(original).requestsLeft;

        // If no requests remain at all (that is, there were no requests we
        // could provide before we ran into this invalidation) then we do not
        // need this original at all.
        if (requestInfos[original].requests == 0) {
          requestInfos.erase(original);
        }

        activeOriginals.erase(original);
      }
    }

    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }
    auto& info = iter->second;
    info.validate();

    if (info.requests > 0) {
      // This is an original. Compute its side effects, as we cannot optimize
      // away repeated apperances if it has any.
      EffectAnalyzer effects(options, *getModule(), curr);

      // We can ignore traps here, as we replace a repeating expression with a
      // single appearance of it, a store to a local, and gets in the other
      // locations, and so if the expression traps then the first appearance -
      // that we keep around - would trap, and the others are never reached
      // anyhow. (The other checks we perform here, including invalidation and
      // determinism, will ensure that either all of the appearances trap, or
      // none of them.)
      effects.trap = false;

      // We also cannot optimize away something that is intrinsically
      // nondeterministic: even if it has no side effects, if it may return a
      // different result each time, then we cannot optimize away repeats.
      if (effects.hasSideEffects() ||
          Properties::isGenerative(curr, getModule()->features)) {
        requestInfos.erase(curr);
      } else {
        activeOriginals.emplace(
          curr, ActiveOriginalInfo{info.requests, std::move(effects)});
      }
    } else if (info.original) {
      // The original may have already been invalidated. If so, remove our info
      // as well.
      auto originalIter = activeOriginals.find(info.original);
      if (originalIter == activeOriginals.end()) {
        requestInfos.erase(iter);
        return;
      }

      // After visiting this expression, we have one less request for its
      // original, and perhaps none are left.
      auto& originalInfo = originalIter->second;
      if (originalInfo.requestsLeft == 1) {
        activeOriginals.erase(info.original);
      } else {
        originalInfo.requestsLeft--;
      }
    }
  }